

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

int Abc_NtkGetLitNum(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int i;
  int iVar3;
  
  if (pNtk->ntkFunc != ABC_FUNC_SOP) {
    __assert_fail("Abc_NtkHasSop(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                  ,0xaf,"int Abc_NtkGetLitNum(Abc_Ntk_t *)");
  }
  i = 0;
  iVar3 = 0;
  do {
    if (pNtk->vObjs->nSize <= i) {
      return iVar3;
    }
    pAVar2 = Abc_NtkObj(pNtk,i);
    if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) {
      if ((char *)(pAVar2->field_5).pData == (char *)0x0) {
        __assert_fail("pNode->pData",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                      ,0xb2,"int Abc_NtkGetLitNum(Abc_Ntk_t *)");
      }
      iVar1 = Abc_SopGetLitNum((char *)(pAVar2->field_5).pData);
      iVar3 = iVar3 + iVar1;
    }
    i = i + 1;
  } while( true );
}

Assistant:

int Abc_NtkGetLitNum( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i, nLits = 0;
    assert( Abc_NtkHasSop(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        assert( pNode->pData );
        nLits += Abc_SopGetLitNum( (char *)pNode->pData );
    }
    return nLits;
}